

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::DitheringCase::checkColor
          (DitheringCase *this,Vec4 *inputClr,RGBA *renderedClr,bool logErrors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  byte *pbVar5;
  float *pfVar6;
  size_type sVar7;
  reference pvVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  float fVar11;
  float fVar12;
  MessageBuilder local_558;
  int local_3d4;
  string local_3d0;
  MessageBuilder local_3b0;
  MessageBuilder local_230;
  int local_ac;
  byte local_a5;
  int i;
  bool goodChannel;
  int local_94;
  iterator iStack_90;
  int renderedClrInFormat;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  int local_80;
  int local_7c;
  int local_78 [5];
  int local_64;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> channelChoices;
  bool useRoundingMargin;
  float scaledInput;
  int channelMax;
  int chanNdx;
  bool allChannelsOk;
  IVec4 channelBits;
  bool logErrors_local;
  RGBA *renderedClr_local;
  Vec4 *inputClr_local;
  DitheringCase *this_local;
  
  channelBits.m_data[2]._3_1_ = logErrors;
  unique0x100006d8 = renderedClr;
  pixelFormatToIVec4((Functional *)&chanNdx,&this->m_renderFormat);
  channelMax._3_1_ = true;
  scaledInput = 0.0;
  do {
    if (3 < (int)scaledInput) {
      return channelMax._3_1_;
    }
    piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&chanNdx,(int)scaledInput);
    if (*piVar4 != 0) {
      pbVar5 = (byte *)tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&chanNdx,(int)scaledInput);
      iVar2 = 1 << (*pbVar5 & 0x1f);
      iVar3 = iVar2 + -1;
      pfVar6 = tcu::Vector<float,_4>::operator[](inputClr,(int)scaledInput);
      fVar11 = *pfVar6 * (float)iVar3;
      channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar11;
      fVar12 = deFloatRound(fVar11);
      fVar11 = deFloatAbs(fVar11 - fVar12);
      channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = fVar11 < 0.0001;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
      fVar11 = ::deFloatCeil(channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
      local_64 = de::min<int>(iVar3,(int)fVar11);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_60,&local_64);
      fVar11 = ::deFloatCeil(channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
      local_78[0] = de::max<int>(0,(int)fVar11 + -1);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_60,local_78);
      fVar11 = channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
      if ((channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        fVar12 = deFloatRound(channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
        if (fVar11 <= fVar12) {
          fVar11 = ::deFloatCeil(channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_80 = (int)fVar11 + 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_60,&local_80);
        }
        else {
          fVar11 = ::deFloatCeil(channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_7c = (int)fVar11 + -2;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_60,&local_7c);
        }
      }
      local_88._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_60);
      iStack_90 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_60);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iStack_90._M_current);
      tcu::RGBA::toIVec((RGBA *)&i);
      piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&i,(int)scaledInput);
      fVar11 = deFloatRound((float)(*piVar4 * iVar3) / 255.0);
      local_94 = (int)fVar11;
      local_a5 = 0;
      for (local_ac = 0; iVar3 = local_ac,
          sVar7 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_60), iVar1 = local_94,
          iVar3 < (int)sVar7; local_ac = local_ac + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,(long)local_ac);
        if (iVar1 == *pvVar8) {
          local_a5 = 1;
          break;
        }
      }
      if ((local_a5 & 1) == 0) {
        if ((channelBits.m_data[2]._3_1_ & 1) != 0) {
          pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3b0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [10])"Failure: ");
          piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&chanNdx,(int)scaledInput);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,piVar4);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])"-bit ");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char **)(s_channelNames + (long)(int)scaledInput * 8));
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])0x2b8800e);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_94);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])0x2b85f71);
          choiceListStr<int>(&local_3d0,(vector<int,_std::allocator<int>_> *)local_60);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3d0);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [43])" (corresponding fragment color channel is ");
          pfVar6 = tcu::Vector<float,_4>::operator[](inputClr,(int)scaledInput);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar6);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2a94734);
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_230,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [7])0x2bc177b);
          pfVar6 = tcu::Vector<float,_4>::operator[](inputClr,(int)scaledInput);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar6);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])0x2c08aec);
          local_3d4 = iVar2;
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3d4);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [7])"-1) = ");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(float *)((long)&channelChoices.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                + 4));
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_230);
          std::__cxx11::string::~string((string *)&local_3d0);
          tcu::MessageBuilder::~MessageBuilder(&local_3b0);
          if ((channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
            pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_558,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (&local_558,
                                 (char (*) [109])
                                 "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
                                );
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_558);
          }
        }
        channelMax._3_1_ = false;
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60)
      ;
    }
    scaledInput = (float)((int)scaledInput + 1);
  } while( true );
}

Assistant:

bool DitheringCase::checkColor (const Vec4& inputClr, const tcu::RGBA& renderedClr, const bool logErrors) const
{
	const IVec4		channelBits		= pixelFormatToIVec4(m_renderFormat);
	bool			allChannelsOk	= true;

	for (int chanNdx = 0; chanNdx < 4; chanNdx++)
	{
		if (channelBits[chanNdx] == 0)
			continue;

		const int		channelMax			= (1 << channelBits[chanNdx]) - 1;
		const float		scaledInput			= inputClr[chanNdx] * (float)channelMax;
		const bool		useRoundingMargin	= deFloatAbs(scaledInput - deFloatRound(scaledInput)) < 0.0001f;
		vector<int>		channelChoices;

		channelChoices.push_back(de::min(channelMax,	(int)deFloatCeil(scaledInput)));
		channelChoices.push_back(de::max(0,				(int)deFloatCeil(scaledInput) - 1));

		// If the input color results in a scaled value that is very close to an integer, account for a little bit of possible inaccuracy.
		if (useRoundingMargin)
		{
			if (scaledInput > deFloatRound(scaledInput))
				channelChoices.push_back((int)deFloatCeil(scaledInput) - 2);
			else
				channelChoices.push_back((int)deFloatCeil(scaledInput) + 1);
		}

		std::sort(channelChoices.begin(), channelChoices.end());

		{
			const int		renderedClrInFormat	= (int)deFloatRound((float)(renderedClr.toIVec()[chanNdx] * channelMax) / 255.0f);
			bool			goodChannel			= false;

			for (int i = 0; i < (int)channelChoices.size(); i++)
			{
				if (renderedClrInFormat == channelChoices[i])
				{
					goodChannel = true;
					break;
				}
			}

			if (!goodChannel)
			{
				if (logErrors)
				{
					m_testCtx.getLog() << TestLog::Message
									   << "Failure: " << channelBits[chanNdx] << "-bit " << s_channelNames[chanNdx] << " channel is " << renderedClrInFormat
									   << ", should be " << choiceListStr(channelChoices)
									   << " (corresponding fragment color channel is " << inputClr[chanNdx] << ")"
									   << TestLog::EndMessage
									   << TestLog::Message
									   << "Note: " << inputClr[chanNdx] << " * (" << channelMax + 1 << "-1) = " << scaledInput
									   << TestLog::EndMessage;

					if (useRoundingMargin)
					{
						m_testCtx.getLog() << TestLog::Message
										   << "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
										   << TestLog::EndMessage;
					}
				}

				allChannelsOk = false;
			}
		}
	}

	return allChannelsOk;
}